

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O3

void write_modes_b(AV1_COMP *cpi,ThreadData_conflict *td,TileInfo *tile,aom_writer *w,
                  TokenExtra **tok,TokenExtra *tok_end,int mi_row,int mi_col)

{
  MACROBLOCKD *xd_00;
  segmentation_probs *psVar1;
  nmv_context *mvctx;
  MB_MODE_INFO **ppMVar2;
  uint16_t *icdf;
  AV1_COMMON *cm;
  segmentation *psVar3;
  uint8_t *puVar4;
  aom_cdf_prob (*paaaVar5) [3] [3];
  aom_cdf_prob (*icdf_00) [2] [3];
  byte bVar6;
  BLOCK_SIZE BVar7;
  _Bool _Var8;
  char cVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  _Bool _Var13;
  BLOCK_SIZE BVar14;
  MOTION_MODE MVar15;
  ushort uVar16;
  ushort uVar17;
  uint32_t uVar18;
  MB_MODE_INFO *pMVar19;
  SequenceHeader *pSVar20;
  MB_MODE_INFO_EXT_FRAME *pMVar21;
  MB_MODE_INFO *pMVar22;
  byte bVar23;
  short sVar24;
  WarpedMotionParams *pWVar25;
  aom_cdf_prob (*paaVar26) [3];
  MB_MODE_INFO_EXT_FRAME *pMVar27;
  int m;
  int iVar28;
  int iVar29;
  int iVar30;
  long lVar31;
  scale_factors *psVar32;
  MV_REFERENCE_FRAME *pMVar33;
  MACROBLOCKD *xd_01;
  int_mv *piVar34;
  byte bVar35;
  byte bVar36;
  byte bVar37;
  byte bVar38;
  ulong uVar39;
  MV *mv;
  RefCntBuffer *pRVar40;
  ulong uVar41;
  aom_cdf_prob (*paaVar42) [3];
  ulong uVar43;
  RefCntBuffer *pRVar44;
  uint uVar45;
  aom_bit_depth_t aVar46;
  int idx;
  aom_cdf_prob (*icdf_01) [6] [3];
  aom_cdf_prob (*icdf_02) [9];
  uint uVar47;
  uint uVar48;
  MB_MODE_INFO *pMVar49;
  MB_MODE_INFO *pMVar50;
  long lVar51;
  aom_bit_depth_t aVar52;
  uint uVar53;
  ulong uVar54;
  aom_bit_depth_t aVar55;
  nmv_context *nmvc;
  aom_cdf_prob (*paaVar56) [4];
  aom_cdf_prob (*icdf_03) [5];
  char cVar57;
  short sVar58;
  int idy;
  TokenExtra *pTVar59;
  ThreadData_conflict *pTVar60;
  uint uVar61;
  int iVar62;
  bool bVar63;
  bool bVar64;
  MACROBLOCKD *xd;
  int_mv ref_mv;
  MB_MODE_INFO *in_stack_fffffffffffffed8;
  ThreadData_conflict *pTVar65;
  MB_MODE_INFO *pMVar66;
  MB_MODE_INFO *pMVar67;
  FRAME_CONTEXT *pFVar68;
  aom_cdf_prob *paVar69;
  aom_cdf_prob *token_stats;
  FRAME_CONTEXT *pFVar70;
  FRAME_CONTEXT *pFVar71;
  undefined8 local_68;
  undefined4 local_60;
  ulong local_58;
  MB_MODE_INFO_EXT_FRAME *local_50;
  ulong local_48;
  long local_40;
  int local_34;
  
  pFVar68 = (td->mb).e_mbd.tile_ctx;
  iVar29 = (cpi->common).mi_params.mi_stride;
  uVar61 = (uint)tok_end;
  iVar28 = iVar29 * uVar61 + mi_row;
  ppMVar2 = (cpi->common).mi_params.mi_grid_base + iVar28;
  (td->mb).e_mbd.mi = ppMVar2;
  local_50 = (cpi->mbmi_ext_info).frame_base;
  lVar31 = (long)((int)((long)((ulong)(uint)((int)uVar61 >> 0x1f) << 0x20 |
                              (ulong)tok_end & 0xffffffff) /
                       (long)(int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                        [(cpi->common).mi_params.mi_alloc_bsize]) *
                  (cpi->mbmi_ext_info).stride +
                 mi_row / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                     [(cpi->common).mi_params.mi_alloc_bsize]);
  local_40 = lVar31 * 0x54;
  pMVar21 = local_50 + lVar31;
  (td->mb).mbmi_ext_frame = pMVar21;
  (td->mb).e_mbd.tx_type_map = (cpi->common).mi_params.tx_type_map + iVar28;
  (td->mb).e_mbd.tx_type_map_stride = iVar29;
  pMVar19 = *ppMVar2;
  local_58 = (ulong)pMVar19->bsize;
  bVar37 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[local_58];
  bVar6 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[local_58];
  iVar29 = (cpi->common).mi_params.mi_rows;
  iVar28 = (cpi->common).mi_params.mi_cols;
  iVar30 = tile->mi_row_start;
  iVar62 = tile->mi_col_start;
  (td->mb).e_mbd.mb_to_top_edge = uVar61 * -0x20;
  local_48 = (ulong)bVar37;
  (td->mb).e_mbd.mb_to_bottom_edge = (iVar29 - (bVar37 + uVar61)) * 0x20;
  (td->mb).e_mbd.mb_to_left_edge = mi_row * -0x20;
  (td->mb).e_mbd.mb_to_right_edge = (iVar28 - ((uint)bVar6 + mi_row)) * 0x20;
  (td->mb).e_mbd.mi_row = uVar61;
  (td->mb).e_mbd.mi_col = mi_row;
  (td->mb).e_mbd.left_available = iVar62 < mi_row;
  (td->mb).e_mbd.up_available = iVar30 < (int)uVar61;
  uVar47 = (td->mb).e_mbd.plane[1].subsampling_x;
  uVar53 = (td->mb).e_mbd.plane[1].subsampling_y;
  (td->mb).e_mbd.chroma_up_available = iVar30 < (int)uVar61;
  bVar64 = iVar62 < mi_row + -1;
  if (uVar47 == 0) {
    bVar64 = iVar62 < mi_row;
  }
  if ((0x3efffcUL >> (local_58 & 0x3f) & 1) != 0) {
    bVar64 = iVar62 < mi_row;
  }
  (td->mb).e_mbd.chroma_left_available = bVar64;
  uVar48 = uVar61;
  if ((0x20005UL >> (local_58 & 0x3f) & 1) != 0 && uVar53 != 0) {
    uVar48 = uVar61 - 1;
    (td->mb).e_mbd.chroma_up_available = iVar30 < (int)uVar48;
  }
  if (iVar30 < (int)uVar61) {
    pMVar50 = ppMVar2[-(long)(td->mb).e_mbd.mi_stride];
  }
  else {
    pMVar50 = (MB_MODE_INFO *)0x0;
  }
  (td->mb).e_mbd.above_mbmi = pMVar50;
  if (iVar62 < mi_row) {
    pMVar50 = ppMVar2[-1];
  }
  else {
    pMVar50 = (MB_MODE_INFO *)0x0;
  }
  (td->mb).e_mbd.left_mbmi = pMVar50;
  if ((((ulong)tok_end & 1) == 0) && ((bVar37 & uVar53 != 0) != 0)) {
    (td->mb).e_mbd.is_chroma_ref = false;
  }
  else {
    if (((mi_row & 1U) == 0) && ((bVar6 & 1) != 0)) {
      (td->mb).e_mbd.is_chroma_ref = uVar47 == 0;
      if (uVar47 != 0) goto LAB_001934f4;
    }
    else {
      (td->mb).e_mbd.is_chroma_ref = true;
    }
    iVar29 = (td->mb).e_mbd.mi_stride;
    iVar28 = (uVar47 & mi_row) + (uVar53 & uVar61) * iVar29;
    if (iVar30 < (int)uVar48) {
      pMVar50 = ppMVar2[(long)-iVar28 + (long)(int)(uVar47 - iVar29)];
    }
    else {
      pMVar50 = (MB_MODE_INFO *)0x0;
    }
    (td->mb).e_mbd.chroma_above_mbmi = pMVar50;
    if (bVar64 == false) {
      pMVar50 = (MB_MODE_INFO *)0x0;
    }
    else {
      pMVar50 = ppMVar2[(long)-iVar28 + (long)(int)(iVar29 * uVar53) + -1];
    }
    (td->mb).e_mbd.chroma_left_mbmi = pMVar50;
  }
LAB_001934f4:
  (td->mb).e_mbd.height = bVar37;
  (td->mb).e_mbd.width = bVar6;
  (td->mb).e_mbd.is_last_vertical_rect = false;
  if ((bVar6 < bVar37) && (((uint)bVar6 + mi_row & bVar37 - 1) == 0)) {
    (td->mb).e_mbd.is_last_vertical_rect = true;
  }
  (td->mb).e_mbd.is_first_horizontal_rect = false;
  if ((bVar37 < bVar6) && ((bVar6 - 1 & uVar61) == 0)) {
    (td->mb).e_mbd.is_first_horizontal_rect = true;
  }
  cm = &cpi->common;
  xd_00 = &(td->mb).e_mbd;
  (td->mb).e_mbd.above_txfm_context = (cpi->common).above_contexts.txfm[tile->tile_row] + mi_row;
  (td->mb).e_mbd.left_txfm_context = (td->mb).e_mbd.left_txfm_context_buffer + (uVar61 & 0x1f);
  uVar47 = (uint)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  if (((cpi->common).current_frame.frame_type & 0xfd) == 0) {
    psVar3 = &(cpi->common).seg;
    psVar1 = &pFVar68->seg;
    pMVar50 = *ppMVar2;
    if (((cpi->common).seg.segid_preskip != '\0') && ((cpi->common).seg.update_map != '\0')) {
      in_stack_fffffffffffffed8 = (MB_MODE_INFO *)((ulong)uVar47 << 0x20);
      write_segment_id(cpi,xd_00,pMVar50,w,psVar3,psVar1,0);
    }
    iVar29 = write_skip(cm,xd_00,(byte)*(undefined2 *)&pMVar50->field_0xa7 & 7,pMVar50,w);
    if (((cpi->common).seg.segid_preskip == '\0') && ((cpi->common).seg.update_map != '\0')) {
      in_stack_fffffffffffffed8 =
           (MB_MODE_INFO *)CONCAT44((int)((ulong)in_stack_fffffffffffffed8 >> 0x20),iVar29);
      write_segment_id(cpi,xd_00,pMVar50,w,psVar3,psVar1,iVar29);
    }
    if (((cpi->common).features.coded_lossless == false) &&
       ((cpi->common).features.allow_intrabc == false)) {
      pSVar20 = (cpi->common).seq_params;
      uVar47 = (td->mb).e_mbd.mi_row;
      uVar53 = (td->mb).e_mbd.mi_col;
      if ((pSVar20->mib_size - 1U & (uVar53 | uVar47)) == 0) {
        (td->mb).e_mbd.cdef_transmitted[0] = false;
        (td->mb).e_mbd.cdef_transmitted[1] = false;
        (td->mb).e_mbd.cdef_transmitted[2] = false;
        (td->mb).e_mbd.cdef_transmitted[3] = false;
      }
      uVar43 = 0;
      if (pSVar20->sb_size == BLOCK_128X128) {
        uVar43 = (ulong)(uVar47 >> 3 & 2 | uVar53 >> 4 & 1);
      }
      if ((iVar29 == 0) && ((td->mb).e_mbd.cdef_transmitted[uVar43] == false)) {
        iVar29 = (cpi->common).cdef_info.cdef_bits;
        if (0 < iVar29) {
          sVar58 = *(short *)&(cpi->common).mi_params.mi_grid_base
                              [(int)((uVar47 & 0xfffffff0) * (cpi->common).mi_params.mi_stride +
                                    (uVar53 & 0xfffffff0))]->field_0xa7;
          pMVar33 = ((MB_MODE_INFO *)w)->ref_frame;
          uVar47 = iVar29 + 1;
          do {
            od_ec_encode_bool_q15
                      ((od_ec_enc *)pMVar33,
                       (uint)(((uint)((int)(short)(sVar58 * 2) >> 0xc) >> (uVar47 - 2 & 0x1f) & 1)
                             != 0),0x4000);
            uVar47 = uVar47 - 1;
          } while (1 < uVar47);
        }
        (td->mb).e_mbd.cdef_transmitted[uVar43] = true;
        iVar29 = 0;
      }
    }
    write_delta_q_params(cm,xd_00,iVar29,w);
    pMVar49 = (MB_MODE_INFO *)w;
    if (((((cm->current_frame).frame_type & 0xfd) == 0) &&
        ((cpi->common).features.allow_screen_content_tools == true)) &&
       ((cpi->common).features.allow_intrabc != false)) {
      pFVar71 = (td->mb).e_mbd.tile_ctx;
      pMVar67 = *(td->mb).e_mbd.mi;
      uVar47 = *(ushort *)&pMVar67->field_0xa7 >> 7 & 1;
      od_ec_encode_cdf_q15
                ((od_ec_enc *)((MB_MODE_INFO *)w)->ref_frame,uVar47,pFVar71->intrabc_cdf,2);
      sVar58 = (short)uVar47;
      if ((char)(((MB_MODE_INFO *)w)->wm_params).wmmat[5] != '\0') {
        uVar16 = pFVar71->intrabc_cdf[2];
        bVar37 = (char)(uVar16 >> 4) + 4;
        uVar17 = pFVar71->intrabc_cdf[0];
        if (sVar58 == 0) {
          sVar24 = -(uVar17 >> (bVar37 & 0x1f));
        }
        else {
          sVar24 = (short)((int)(0x8000 - (uint)uVar17) >> (bVar37 & 0x1f));
        }
        pFVar71->intrabc_cdf[0] = sVar24 + uVar17;
        pFVar71->intrabc_cdf[2] = uVar16 + (uVar16 < 0x20);
      }
      if (sVar58 != 0) {
        local_68 = CONCAT44(local_68._4_4_,pMVar21->ref_mv_stack[0].this_mv.as_int);
        av1_encode_dv((aom_writer *)pMVar49,&pMVar67->mv[0].as_mv,(MV *)&local_68,&pFVar71->ndvc);
      }
      pTVar60 = td;
      if ((pMVar50->field_0xa7 & 0x80) == 0) goto LAB_00193ecc;
    }
    else {
LAB_00193ecc:
      iVar29 = 1;
LAB_00193ede:
      write_intra_prediction_modes(cm,xd_00,iVar29,(aom_writer *)pMVar49);
      pTVar60 = td;
    }
  }
  else {
    bVar37 = (*ppMVar2)->ref_frame[0];
    bVar38 = (*ppMVar2)->ref_frame[1];
    if ((char)bVar37 < '\t') {
      bVar35 = 1;
      if ('\x01' < (char)bVar37) {
        bVar35 = bVar37;
      }
      iVar29 = (cpi->common).remapped_ref_idx[bVar35 - 1];
      if (iVar29 == -1) goto LAB_001935ee;
      psVar32 = (cpi->common).ref_scale_factors + iVar29;
    }
    else {
LAB_001935ee:
      psVar32 = (scale_factors *)0x0;
    }
    (td->mb).e_mbd.block_ref_scale_factors[0] = psVar32;
    if ((char)bVar38 < '\t') {
      bVar37 = 1;
      if ('\x01' < (char)bVar38) {
        bVar37 = bVar38;
      }
      iVar29 = (cpi->common).remapped_ref_idx[bVar37 - 1];
      if (iVar29 == -1) goto LAB_0019362b;
      psVar32 = (cpi->common).ref_scale_factors + iVar29;
    }
    else {
LAB_0019362b:
      psVar32 = (scale_factors *)0x0;
    }
    (td->mb).e_mbd.block_ref_scale_factors[1] = psVar32;
    psVar3 = &(cpi->common).seg;
    psVar1 = &pFVar68->seg;
    pMVar50 = *ppMVar2;
    bVar37 = pMVar50->field_0xa7;
    uVar53 = 1;
    if (-1 < (char)bVar37) {
      uVar53 = (uint)('\0' < pMVar50->ref_frame[0]);
    }
    BVar7 = pMVar50->bsize;
    bVar38 = pMVar50->mode;
    uVar61 = (uint)(cpi->common).features.allow_high_precision_mv;
    cVar57 = pMVar50->ref_frame[1];
    uVar43 = CONCAT44(uVar47,1);
    write_inter_segment_id(cpi,xd_00,w,psVar3,psVar1,0,1);
    if (((cpi->common).current_frame.skip_mode_info.skip_mode_flag != 0) &&
       ((psVar3->enabled == '\0' ||
        (((cpi->common).seg.feature_mask[(ulong)bVar37 & 7] & 0x40) == 0)))) {
      bVar35 = block_size_high[pMVar50->bsize];
      if (block_size_wide[pMVar50->bsize] < block_size_high[pMVar50->bsize]) {
        bVar35 = block_size_wide[pMVar50->bsize];
      }
      if ((7 < bVar35) &&
         ((psVar3->enabled == '\0' ||
          (((cpi->common).seg.feature_mask[(ulong)bVar37 & 7] & 0xa0) == 0)))) {
        pMVar49 = (td->mb).e_mbd.left_mbmi;
        pMVar67 = (td->mb).e_mbd.above_mbmi;
        if (pMVar67 == (MB_MODE_INFO *)0x0) {
          uVar41 = 0;
        }
        else {
          uVar41 = (ulong)(*(ushort *)&pMVar67->field_0xa7 >> 6 & 1);
        }
        uVar47 = *(ushort *)&pMVar50->field_0xa7 >> 6 & 1;
        if (pMVar49 == (MB_MODE_INFO *)0x0) {
          uVar39 = 0;
        }
        else {
          uVar39 = (ulong)(*(ushort *)&pMVar49->field_0xa7 >> 6 & 1);
        }
        lVar31 = uVar39 + uVar41;
        pFVar71 = (td->mb).e_mbd.tile_ctx;
        paaVar42 = pFVar71->skip_mode_cdfs + lVar31;
        od_ec_encode_cdf_q15((od_ec_enc *)((MB_MODE_INFO *)w)->ref_frame,uVar47,*paaVar42,2);
        if (*(char *)((((MB_MODE_INFO *)w)->wm_params).wmmat + 5) != '\0') {
          uVar16 = pFVar71->skip_mode_cdfs[lVar31][2];
          bVar35 = (char)(uVar16 >> 4) + 4;
          uVar17 = (*paaVar42)[0];
          if ((short)uVar47 == 0) {
            sVar58 = -(uVar17 >> (bVar35 & 0x1f));
          }
          else {
            sVar58 = (short)((int)(0x8000 - (uint)uVar17) >> (bVar35 & 0x1f));
          }
          (*paaVar42)[0] = sVar58 + uVar17;
          pFVar71->skip_mode_cdfs[lVar31][2] = uVar16 + (uVar16 < 0x20);
        }
      }
    }
    iVar29 = 1;
    if ((pMVar50->field_0xa7 & 0x40) == 0) {
      iVar29 = write_skip(cm,xd_00,bVar37 & 7,pMVar50,w);
    }
    in_stack_fffffffffffffed8 = (MB_MODE_INFO *)(uVar43 & 0xffffffff00000000);
    write_inter_segment_id(cpi,xd_00,w,psVar3,psVar1,iVar29,0);
    if (((cpi->common).features.coded_lossless == false) &&
       ((cpi->common).features.allow_intrabc == false)) {
      pSVar20 = (cpi->common).seq_params;
      uVar47 = (td->mb).e_mbd.mi_row;
      uVar48 = (td->mb).e_mbd.mi_col;
      if ((pSVar20->mib_size - 1U & (uVar48 | uVar47)) == 0) {
        (td->mb).e_mbd.cdef_transmitted[0] = false;
        (td->mb).e_mbd.cdef_transmitted[1] = false;
        (td->mb).e_mbd.cdef_transmitted[2] = false;
        (td->mb).e_mbd.cdef_transmitted[3] = false;
      }
      uVar43 = 0;
      if (pSVar20->sb_size == BLOCK_128X128) {
        uVar43 = (ulong)(uVar47 >> 3 & 2 | uVar48 >> 4 & 1);
      }
      if ((iVar29 == 0) && ((td->mb).e_mbd.cdef_transmitted[uVar43] == false)) {
        iVar28 = (cpi->common).cdef_info.cdef_bits;
        if (0 < iVar28) {
          sVar58 = *(short *)&(cpi->common).mi_params.mi_grid_base
                              [(int)((uVar47 & 0xfffffff0) * (cpi->common).mi_params.mi_stride +
                                    (uVar48 & 0xfffffff0))]->field_0xa7;
          pMVar33 = ((MB_MODE_INFO *)w)->ref_frame;
          uVar47 = iVar28 + 1;
          do {
            od_ec_encode_bool_q15
                      ((od_ec_enc *)pMVar33,
                       (uint)(((uint)((int)(short)(sVar58 * 2) >> 0xc) >> (uVar47 - 2 & 0x1f) & 1)
                             != 0),0x4000);
            uVar47 = uVar47 - 1;
          } while (1 < uVar47);
        }
        (td->mb).e_mbd.cdef_transmitted[uVar43] = true;
      }
    }
    write_delta_q_params(cm,xd_00,iVar29,w);
    pMVar49 = (MB_MODE_INFO *)w;
    if (((*(ushort *)&pMVar50->field_0xa7 & 0x40) == 0) &&
       ((psVar3->enabled == '\0' ||
        (((cpi->common).seg.feature_mask[*(ushort *)&pMVar50->field_0xa7 & 7] & 0xa0) == 0)))) {
      iVar29 = av1_get_intra_inter_context(xd_00);
      paaVar42 = ((td->mb).e_mbd.tile_ctx)->intra_inter_cdf + iVar29;
      pMVar49 = (MB_MODE_INFO *)w;
      od_ec_encode_cdf_q15((od_ec_enc *)((MB_MODE_INFO *)w)->ref_frame,uVar53,*paaVar42,2);
      if ((char)(((MB_MODE_INFO *)w)->wm_params).wmmat[5] != '\0') {
        uVar16 = (*paaVar42)[2];
        bVar35 = (char)(uVar16 >> 4) + 4;
        uVar17 = (*paaVar42)[0];
        if (uVar53 == 0) {
          sVar58 = -(uVar17 >> (bVar35 & 0x1f));
        }
        else {
          sVar58 = (short)((int)(0x8000 - (uint)uVar17) >> (bVar35 & 0x1f));
        }
        (*paaVar42)[0] = sVar58 + uVar17;
        (*paaVar42)[2] = uVar16 + (uVar16 < 0x20);
      }
    }
    pTVar60 = td;
    if ((pMVar50->field_0xa7 & 0x40) == 0) {
      if (uVar53 == 0) {
        iVar29 = 0;
        goto LAB_00193ede;
      }
      (td->mb).e_mbd.neighbors_ref_counts[0] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[1] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[2] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[3] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[4] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[5] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[6] = '\0';
      (td->mb).e_mbd.neighbors_ref_counts[7] = '\0';
      _Var8 = (td->mb).e_mbd.left_available;
      if ((td->mb).e_mbd.up_available == true) {
        pMVar67 = (td->mb).e_mbd.above_mbmi;
        if ((pMVar67->field_0xa7 & 0x80) != 0 || '\0' < pMVar67->ref_frame[0]) {
          puVar4 = (td->mb).e_mbd.neighbors_ref_counts + pMVar67->ref_frame[0];
          *puVar4 = *puVar4 + '\x01';
          if (0 < (long)pMVar67->ref_frame[1]) {
            puVar4 = (td->mb).e_mbd.neighbors_ref_counts + pMVar67->ref_frame[1];
            *puVar4 = *puVar4 + '\x01';
          }
        }
      }
      if (_Var8 != false) {
        pMVar67 = (td->mb).e_mbd.left_mbmi;
        if ((pMVar67->field_0xa7 & 0x80) != 0 || '\0' < pMVar67->ref_frame[0]) {
          puVar4 = (td->mb).e_mbd.neighbors_ref_counts + pMVar67->ref_frame[0];
          *puVar4 = *puVar4 + '\x01';
          if (0 < (long)pMVar67->ref_frame[1]) {
            puVar4 = (td->mb).e_mbd.neighbors_ref_counts + pMVar67->ref_frame[1];
            *puVar4 = *puVar4 + '\x01';
          }
        }
      }
      pMVar67 = *(td->mb).e_mbd.mi;
      cVar9 = pMVar67->ref_frame[1];
      if ((psVar3->enabled == '\0') ||
         (((cpi->common).seg.feature_mask[*(ushort *)&pMVar67->field_0xa7 & 7] & 0xe0) == 0)) {
        pMVar66 = pMVar49;
        if ((cpi->common).current_frame.reference_mode == '\x02') {
          bVar35 = block_size_high[pMVar67->bsize];
          if (block_size_wide[pMVar67->bsize] < block_size_high[pMVar67->bsize]) {
            bVar35 = block_size_wide[pMVar67->bsize];
          }
          if (7 < bVar35) {
            pFVar71 = (td->mb).e_mbd.tile_ctx;
            iVar29 = av1_get_reference_mode_context(xd_00);
            paaVar42 = pFVar71->comp_inter_cdf + iVar29;
            pMVar66 = pMVar49;
            od_ec_encode_cdf_q15((od_ec_enc *)pMVar49->ref_frame,(uint)('\0' < cVar9),*paaVar42,2);
            if ((char)(pMVar49->wm_params).wmmat[5] != '\0') {
              uVar16 = pFVar71->comp_inter_cdf[iVar29][2];
              bVar35 = (char)(uVar16 >> 4) + 4;
              uVar17 = (*paaVar42)[0];
              if (cVar9 < '\x01') {
                sVar58 = -(uVar17 >> (bVar35 & 0x1f));
              }
              else {
                sVar58 = (short)((int)(0x8000 - (uint)uVar17) >> (bVar35 & 0x1f));
              }
              (*paaVar42)[0] = sVar58 + uVar17;
              pFVar71->comp_inter_cdf[iVar29][2] = uVar16 + (uVar16 < 0x20);
            }
          }
        }
        if (cVar9 < '\x01') {
          bVar35 = pMVar67->ref_frame[0] - 5;
          pFVar71 = (td->mb).e_mbd.tile_ctx;
          iVar29 = av1_get_pred_context_single_ref_p1(xd_00);
          icdf_01 = pFVar71->single_ref_cdf + iVar29;
          pMVar33 = pMVar66->ref_frame;
          pMVar49 = pMVar66;
          od_ec_encode_cdf_q15((od_ec_enc *)pMVar33,(uint)(bVar35 < 3),(uint16_t *)icdf_01,2);
          if ((char)(pMVar66->wm_params).wmmat[5] != '\0') {
            uVar16 = pFVar71->single_ref_cdf[iVar29][0][2];
            bVar36 = (char)(uVar16 >> 4) + 4;
            uVar17 = (*icdf_01)[0][0];
            if (bVar35 < 3) {
              sVar58 = (short)((int)(0x8000 - (uint)uVar17) >> (bVar36 & 0x1f));
            }
            else {
              sVar58 = -(uVar17 >> (bVar36 & 0x1f));
            }
            (*icdf_01)[0][0] = sVar58 + uVar17;
            pFVar71->single_ref_cdf[iVar29][0][2] = uVar16 + (uVar16 < 0x20);
          }
          cVar9 = pMVar67->ref_frame[0];
          if (bVar35 < 3) {
            pFVar71 = (td->mb).e_mbd.tile_ctx;
            iVar29 = av1_get_pred_context_single_ref_p2(xd_00);
            paaVar42 = pFVar71->single_ref_cdf[iVar29] + 1;
            od_ec_encode_cdf_q15((od_ec_enc *)pMVar33,(uint)(cVar9 == '\a'),*paaVar42,2);
            if ((char)(pMVar49->wm_params).wmmat[5] != '\0') {
              uVar16 = pFVar71->single_ref_cdf[iVar29][1][2];
              bVar35 = (char)(uVar16 >> 4) + 4;
              uVar17 = (*paaVar42)[0];
              if (cVar9 == '\a') {
                sVar58 = (short)((int)(0x8000 - (uint)uVar17) >> (bVar35 & 0x1f));
              }
              else {
                sVar58 = -(uVar17 >> (bVar35 & 0x1f));
              }
              (*paaVar42)[0] = sVar58 + uVar17;
              pFVar71->single_ref_cdf[iVar29][1][2] = uVar16 + (uVar16 < 0x20);
            }
            if (cVar9 == '\a') goto LAB_0019528f;
            uVar47 = (uint)(pMVar67->ref_frame[0] == '\x06');
            pFVar71 = (td->mb).e_mbd.tile_ctx;
            iVar29 = av1_get_pred_context_single_ref_p6(xd_00);
            paaVar42 = pFVar71->single_ref_cdf[iVar29] + 5;
          }
          else {
            bVar35 = cVar9 - 3;
            pFVar71 = (td->mb).e_mbd.tile_ctx;
            iVar29 = av1_get_pred_context_single_ref_p3(xd_00);
            paaVar42 = pFVar71->single_ref_cdf[iVar29] + 2;
            od_ec_encode_cdf_q15((od_ec_enc *)pMVar33,(uint)(bVar35 < 2),*paaVar42,2);
            if ((char)(pMVar49->wm_params).wmmat[5] != '\0') {
              uVar16 = pFVar71->single_ref_cdf[iVar29][2][2];
              bVar36 = (char)(uVar16 >> 4) + 4;
              uVar17 = (*paaVar42)[0];
              if (bVar35 < 2) {
                sVar58 = (short)((int)(0x8000 - (uint)uVar17) >> (bVar36 & 0x1f));
              }
              else {
                sVar58 = -(uVar17 >> (bVar36 & 0x1f));
              }
              (*paaVar42)[0] = sVar58 + uVar17;
              pFVar71->single_ref_cdf[iVar29][2][2] = uVar16 + (uVar16 < 0x20);
            }
            pFVar71 = (td->mb).e_mbd.tile_ctx;
            if (bVar35 < 2) {
              uVar47 = (uint)(pMVar67->ref_frame[0] != '\x03');
              iVar29 = av1_get_pred_context_single_ref_p5(xd_00);
              paaVar42 = pFVar71->single_ref_cdf[iVar29] + 4;
            }
            else {
              uVar47 = (uint)(pMVar67->ref_frame[0] != '\x01');
              iVar29 = av1_get_pred_context_single_ref_p4(xd_00);
              paaVar42 = pFVar71->single_ref_cdf[iVar29] + 3;
            }
          }
LAB_00195279:
          aom_write_symbol((aom_writer *)pMVar49,uVar47,*paaVar42,2);
        }
        else {
          if (pMVar67->ref_frame[1] < '\x01') {
            uVar47 = 0;
          }
          else {
            uVar47 = (uint)((byte)pMVar67->ref_frame[1] < 5 != '\x04' < pMVar67->ref_frame[0]);
          }
          iVar29 = av1_get_comp_reference_type_context(xd_00);
          paaVar42 = ((td->mb).e_mbd.tile_ctx)->comp_ref_type_cdf + iVar29;
          pMVar33 = pMVar66->ref_frame;
          pMVar49 = pMVar66;
          od_ec_encode_cdf_q15((od_ec_enc *)pMVar33,uVar47 ^ 1,*paaVar42,2);
          if ((char)(pMVar66->wm_params).wmmat[5] != '\0') {
            uVar16 = (*paaVar42)[2];
            bVar35 = (char)(uVar16 >> 4) + 4;
            uVar17 = (*paaVar42)[0];
            if (uVar47 == 0) {
              sVar58 = (short)((int)(0x8000 - (uint)uVar17) >> (bVar35 & 0x1f));
            }
            else {
              sVar58 = -(uVar17 >> (bVar35 & 0x1f));
            }
            (*paaVar42)[0] = uVar17 + sVar58;
            (*paaVar42)[2] = uVar16 + (uVar16 < 0x20);
          }
          cVar9 = pMVar67->ref_frame[0];
          if (uVar47 == 0) {
            bVar35 = cVar9 - 3;
            iVar29 = av1_get_pred_context_comp_ref_p(xd_00);
            paaaVar5 = ((td->mb).e_mbd.tile_ctx)->comp_ref_cdf + iVar29;
            od_ec_encode_cdf_q15((od_ec_enc *)pMVar33,(uint)(bVar35 < 2),(uint16_t *)paaaVar5,2);
            if ((char)(pMVar49->wm_params).wmmat[5] != '\0') {
              uVar16 = (*paaaVar5)[0][2];
              bVar36 = (char)(uVar16 >> 4) + 4;
              uVar17 = (*paaaVar5)[0][0];
              if (bVar35 < 2) {
                sVar58 = (short)((int)(0x8000 - (uint)uVar17) >> (bVar36 & 0x1f));
              }
              else {
                sVar58 = -(uVar17 >> (bVar36 & 0x1f));
              }
              (*paaaVar5)[0][0] = sVar58 + uVar17;
              (*paaaVar5)[0][2] = uVar16 + (uVar16 < 0x20);
            }
            if (bVar35 < 2) {
              bVar64 = pMVar67->ref_frame[0] == '\x04';
              iVar29 = av1_get_pred_context_comp_ref_p2(xd_00);
              lVar31 = 2;
            }
            else {
              bVar64 = pMVar67->ref_frame[0] == '\x02';
              iVar29 = av1_get_pred_context_comp_ref_p1(xd_00);
              lVar31 = 1;
            }
            pFVar71 = (td->mb).e_mbd.tile_ctx;
            paaVar42 = pFVar71->comp_ref_cdf[iVar29] + lVar31;
            od_ec_encode_cdf_q15((od_ec_enc *)pMVar33,(uint)bVar64,*paaVar42,2);
            if ((char)(pMVar49->wm_params).wmmat[5] != '\0') {
              uVar16 = pFVar71->comp_ref_cdf[iVar29][lVar31][2];
              bVar35 = (char)(uVar16 >> 4) + 4;
              uVar17 = (*paaVar42)[0];
              if (bVar64 == false) {
                sVar58 = -(uVar17 >> (bVar35 & 0x1f));
              }
              else {
                sVar58 = (short)((int)(0x8000 - (uint)uVar17) >> (bVar35 & 0x1f));
              }
              (*paaVar42)[0] = sVar58 + uVar17;
              pFVar71->comp_ref_cdf[iVar29][lVar31][2] = uVar16 + (uVar16 < 0x20);
            }
            cVar9 = pMVar67->ref_frame[1];
            iVar29 = av1_get_pred_context_comp_bwdref_p(xd_00);
            icdf_00 = ((td->mb).e_mbd.tile_ctx)->comp_bwdref_cdf + iVar29;
            od_ec_encode_cdf_q15((od_ec_enc *)pMVar33,(uint)(cVar9 == '\a'),(uint16_t *)icdf_00,2);
            if ((char)(pMVar49->wm_params).wmmat[5] != '\0') {
              uVar16 = (*icdf_00)[0][2];
              bVar35 = (char)(uVar16 >> 4) + 4;
              uVar17 = (*icdf_00)[0][0];
              if (cVar9 == '\a') {
                sVar58 = (short)((int)(0x8000 - (uint)uVar17) >> (bVar35 & 0x1f));
              }
              else {
                sVar58 = -(uVar17 >> (bVar35 & 0x1f));
              }
              (*icdf_00)[0][0] = sVar58 + uVar17;
              (*icdf_00)[0][2] = uVar16 + (uVar16 < 0x20);
            }
            if (cVar9 != '\a') {
              cVar9 = pMVar67->ref_frame[1];
              iVar29 = av1_get_pred_context_comp_bwdref_p1(xd_00);
              paaVar26 = ((td->mb).e_mbd.tile_ctx)->comp_bwdref_cdf[iVar29];
              paaVar42 = paaVar26 + 1;
              od_ec_encode_cdf_q15((od_ec_enc *)pMVar33,(uint)(cVar9 == '\x06'),*paaVar42,2);
              if ((char)(pMVar49->wm_params).wmmat[5] != '\0') {
                uVar16 = paaVar26[1][2];
                bVar35 = (char)(uVar16 >> 4) + 4;
                uVar17 = (*paaVar42)[0];
                if (cVar9 == '\x06') {
                  sVar58 = (short)((int)(0x8000 - (uint)uVar17) >> (bVar35 & 0x1f));
                }
                else {
                  sVar58 = -(uVar17 >> (bVar35 & 0x1f));
                }
                (*paaVar42)[0] = sVar58 + uVar17;
                paaVar26[1][2] = uVar16 + (uVar16 < 0x20);
              }
            }
          }
          else {
            iVar29 = av1_get_pred_context_uni_comp_ref_p(xd_00);
            paaaVar5 = ((td->mb).e_mbd.tile_ctx)->uni_comp_ref_cdf + iVar29;
            od_ec_encode_cdf_q15
                      ((od_ec_enc *)pMVar33,(uint)(cVar9 == '\x05'),(uint16_t *)paaaVar5,2);
            if ((char)(pMVar49->wm_params).wmmat[5] != '\0') {
              uVar16 = (*paaaVar5)[0][2];
              bVar35 = (char)(uVar16 >> 4) + 4;
              uVar17 = (*paaaVar5)[0][0];
              if (cVar9 == '\x05') {
                sVar58 = (short)((int)(0x8000 - (uint)uVar17) >> (bVar35 & 0x1f));
              }
              else {
                sVar58 = -(uVar17 >> (bVar35 & 0x1f));
              }
              (*paaaVar5)[0][0] = sVar58 + uVar17;
              (*paaaVar5)[0][2] = uVar16 + (uVar16 < 0x20);
            }
            if (cVar9 != '\x05') {
              bVar35 = pMVar67->ref_frame[1] - 3;
              pTVar60 = td;
              iVar29 = av1_get_pred_context_uni_comp_ref_p1(xd_00);
              pFVar71 = (td->mb).e_mbd.tile_ctx;
              paaVar42 = pFVar71->uni_comp_ref_cdf[iVar29] + 1;
              od_ec_encode_cdf_q15((od_ec_enc *)pMVar33,(uint)(bVar35 < 2),*paaVar42,2);
              if ((char)(pMVar49->wm_params).wmmat[5] != '\0') {
                uVar16 = pFVar71->uni_comp_ref_cdf[iVar29][1][2];
                bVar36 = (char)(uVar16 >> 4) + 4;
                uVar17 = (*paaVar42)[0];
                if (bVar35 < 2) {
                  sVar58 = (short)((int)(0x8000 - (uint)uVar17) >> (bVar36 & 0x1f));
                }
                else {
                  sVar58 = -(uVar17 >> (bVar36 & 0x1f));
                }
                (*paaVar42)[0] = sVar58 + uVar17;
                pFVar71->uni_comp_ref_cdf[iVar29][1][2] = uVar16 + (uVar16 < 0x20);
              }
              td = pTVar60;
              if (bVar35 < 2) {
                uVar47 = (uint)(pMVar67->ref_frame[1] == '\x04');
                iVar29 = av1_get_pred_context_uni_comp_ref_p2(xd_00);
                paaVar42 = ((pTVar60->mb).e_mbd.tile_ctx)->uni_comp_ref_cdf[iVar29] + 2;
                td = pTVar60;
                goto LAB_00195279;
              }
            }
          }
        }
      }
LAB_0019528f:
      uVar47 = (uint)(ushort)pMVar21->mode_context;
      if ('\0' < pMVar50->ref_frame[1]) {
        uVar43 = 4;
        if ((ushort)(uVar47 & 7) < 4) {
          uVar43 = (ulong)(uVar47 & 7);
        }
        uVar47 = (uint)compound_mode_ctx_map[(ushort)pMVar21->mode_context >> 5 & 7][uVar43];
      }
      uVar53 = (uint)bVar38;
      if ((psVar3->enabled == '\0') ||
         (pTVar60 = td, ((cpi->common).seg.feature_mask[(ulong)bVar37 & 7] & 0x40) == 0)) {
        bVar37 = (byte)(uVar53 - 0x11);
        if (bVar37 < 8) {
          pFVar71 = (td->mb).e_mbd.tile_ctx;
          uVar48 = uVar53 - 0x11 & 0xff;
          sVar58 = (short)uVar47;
          icdf_02 = pFVar71->inter_compound_mode_cdf + sVar58;
          pMVar67 = pMVar49;
          od_ec_encode_cdf_q15((od_ec_enc *)pMVar49->ref_frame,uVar48,*icdf_02,8);
          pWVar25 = &pMVar49->wm_params;
          pMVar49 = pMVar67;
          if ((char)pWVar25->wmmat[5] != '\0') {
            uVar16 = pFVar71->inter_compound_mode_cdf[sVar58][8];
            bVar37 = (char)(uVar16 >> 4) + 5;
            uVar43 = 0;
            do {
              uVar17 = (*icdf_02)[uVar43];
              if (uVar43 < uVar48) {
                sVar24 = (short)((int)(0x8000 - (uint)uVar17) >> (bVar37 & 0x1f));
              }
              else {
                sVar24 = -(uVar17 >> (bVar37 & 0x1f));
              }
              (*icdf_02)[uVar43] = sVar24 + uVar17;
              uVar43 = uVar43 + 1;
            } while (uVar43 != 7);
            paVar69 = pFVar71->inter_compound_mode_cdf[sVar58] + 8;
            *paVar69 = *paVar69 + (ushort)(uVar16 < 0x20);
          }
LAB_00195409:
          pFVar71 = pFVar68;
          if (((bVar38 & 0xf7) == 0x10) ||
             ((pTVar60 = td, uVar53 < 0x17 && ((0x644000U >> (uVar53 & 0x1f) & 1) != 0)))) {
LAB_001954dc:
            lVar31 = local_40;
            pMVar27 = local_50;
            bVar37 = pMVar50->mode;
            pTVar60 = td;
            pFVar68 = pFVar71;
            if (bVar37 < 0x19) {
              if ((0x644000U >> (bVar37 & 0x1f) & 1) == 0) {
                if ((0x1010000U >> (bVar37 & 0x1f) & 1) != 0) {
                  pMVar33 = pMVar49->ref_frame;
                  uVar43 = 0;
                  bVar64 = true;
                  do {
                    while ((ulong)pMVar21->ref_mv_count <= uVar43 + 1) {
                      uVar43 = 1;
                      bVar63 = !bVar64;
                      bVar64 = false;
                      if (bVar63) goto LAB_00195740;
                    }
                    bVar63 = pMVar21->weight[uVar43 + 1] < 0x280;
                    uVar41 = (ulong)((uint)bVar63 * 2);
                    if (0x27f < pMVar21->weight[uVar43]) {
                      uVar41 = (ulong)bVar63;
                    }
                    uVar39 = (ulong)(*(ushort *)&pMVar50->field_0xa7 >> 4 & 3);
                    paaVar42 = pFVar71->drl_cdf + uVar41;
                    td = pTVar60;
                    od_ec_encode_cdf_q15((od_ec_enc *)pMVar33,(uint)(uVar43 != uVar39),*paaVar42,2);
                    if ((char)(pMVar49->wm_params).wmmat[5] != '\0') {
                      uVar16 = (*paaVar42)[2];
                      bVar37 = (char)(uVar16 >> 4) + 4;
                      uVar17 = (*paaVar42)[0];
                      if (uVar43 == uVar39) {
                        sVar58 = -(uVar17 >> (bVar37 & 0x1f));
                      }
                      else {
                        sVar58 = (short)((int)(0x8000 - (uint)uVar17) >> (bVar37 & 0x1f));
                      }
                      (*paaVar42)[0] = sVar58 + uVar17;
                      (*paaVar42)[2] = uVar16 + (uVar16 < 0x20);
                    }
                    uVar43 = 1;
                    bVar63 = (bool)(bVar64 & (pMVar50->field_0xa7 & 0x30) != 0);
                    pTVar60 = td;
                    bVar64 = false;
                  } while (bVar63);
                }
              }
              else {
                pMVar33 = pMVar49->ref_frame;
                uVar43 = 0;
                do {
                  while (uVar41 = uVar43 + 1, uVar43 + 2 < (ulong)pMVar21->ref_mv_count) {
                    bVar64 = *(ushort *)((long)pMVar27->weight + uVar43 * 2 + lVar31 + 4) < 0x280;
                    uVar39 = (ulong)((uint)bVar64 * 2);
                    if (0x27f < *(ushort *)((long)pMVar27->weight + uVar43 * 2 + lVar31 + 2)) {
                      uVar39 = (ulong)bVar64;
                    }
                    uVar54 = (ulong)(*(ushort *)&pMVar50->field_0xa7 >> 4 & 3);
                    paaVar42 = pFVar71->drl_cdf + uVar39;
                    td = pTVar60;
                    od_ec_encode_cdf_q15((od_ec_enc *)pMVar33,(uint)(uVar43 != uVar54),*paaVar42,2);
                    if ((char)(pMVar49->wm_params).wmmat[5] != '\0') {
                      uVar16 = (*paaVar42)[2];
                      bVar37 = (char)(uVar16 >> 4) + 4;
                      uVar17 = (*paaVar42)[0];
                      if (uVar43 == uVar54) {
                        sVar58 = -(uVar17 >> (bVar37 & 0x1f));
                      }
                      else {
                        sVar58 = (short)((int)(0x8000 - (uint)uVar17) >> (bVar37 & 0x1f));
                      }
                      (*paaVar42)[0] = sVar58 + uVar17;
                      (*paaVar42)[2] = uVar16 + (uVar16 < 0x20);
                    }
                    pTVar60 = td;
                    if ((1 < uVar41) ||
                       (bVar64 = uVar43 == (*(ushort *)&pMVar50->field_0xa7 >> 4 & 3),
                       uVar43 = uVar41, bVar64)) goto LAB_00195740;
                  }
                  uVar43 = uVar41;
                } while (uVar41 < 2);
              }
            }
          }
          goto LAB_00195740;
        }
        if (bVar37 < 0xfc) goto LAB_00195409;
        paaVar42 = pFVar68->newmv_cdf + (uVar47 & 7);
        pMVar33 = pMVar49->ref_frame;
        pMVar67 = pMVar49;
        od_ec_encode_cdf_q15((od_ec_enc *)pMVar33,(uint)(uVar53 != 0x10),*paaVar42,2);
        if ((char)(pMVar49->wm_params).wmmat[5] != '\0') {
          uVar16 = (*paaVar42)[2];
          bVar37 = (char)(uVar16 >> 4) + 4;
          uVar17 = (*paaVar42)[0];
          if (uVar53 == 0x10) {
            sVar58 = -(uVar17 >> (bVar37 & 0x1f));
          }
          else {
            sVar58 = (short)((int)(0x8000 - (uint)uVar17) >> (bVar37 & 0x1f));
          }
          (*paaVar42)[0] = sVar58 + uVar17;
          (*paaVar42)[2] = uVar16 + (uVar16 < 0x20);
        }
        pMVar49 = pMVar67;
        pFVar71 = pFVar68;
        if (uVar53 == 0x10) goto LAB_001954dc;
        paaVar42 = pFVar68->zeromv_cdf + (uVar47 >> 3 & 1);
        od_ec_encode_cdf_q15((od_ec_enc *)pMVar33,(uint)(uVar53 != 0xf),*paaVar42,2);
        if ((char)(pMVar67->wm_params).wmmat[5] != '\0') {
          uVar16 = (*paaVar42)[2];
          bVar37 = (char)(uVar16 >> 4) + 4;
          uVar17 = (*paaVar42)[0];
          if (uVar53 == 0xf) {
            sVar58 = -(uVar17 >> (bVar37 & 0x1f));
          }
          else {
            sVar58 = (short)((int)(0x8000 - (uint)uVar17) >> (bVar37 & 0x1f));
          }
          (*paaVar42)[0] = sVar58 + uVar17;
          (*paaVar42)[2] = uVar16 + (uVar16 < 0x20);
        }
        pTVar60 = td;
        pMVar49 = pMVar67;
        if (uVar53 != 0xf) {
          paaVar42 = pFVar68->refmv_cdf + (uVar47 >> 4 & 0xf);
          od_ec_encode_cdf_q15((od_ec_enc *)pMVar33,(uint)(uVar53 != 0xd),*paaVar42,2);
          pMVar49 = pMVar67;
          if ((char)(pMVar67->wm_params).wmmat[5] != '\0') {
            uVar16 = (*paaVar42)[2];
            bVar37 = (char)(uVar16 >> 4) + 4;
            uVar17 = (*paaVar42)[0];
            if (uVar53 == 0xd) {
              sVar58 = -(uVar17 >> (bVar37 & 0x1f));
            }
            else {
              sVar58 = (short)((int)(0x8000 - (uint)uVar17) >> (bVar37 & 0x1f));
            }
            (*paaVar42)[0] = sVar58 + uVar17;
            (*paaVar42)[2] = uVar16 + (uVar16 < 0x20);
          }
          goto LAB_00195409;
        }
      }
      else {
LAB_00195740:
        if ((bVar38 & 0xf7) == 0x10) {
          mvctx = &pFVar68->nmvc;
          bVar64 = true;
          lVar31 = 0;
          do {
            pMVar21 = (td->mb).mbmi_ext_frame;
            pMVar67 = *(td->mb).e_mbd.mi;
            bVar37 = pMVar67->ref_frame[1];
            uVar47 = (*(ushort *)&pMVar67->field_0xa7 >> 4 & 3) +
                     (uint)((byte)(pMVar67->mode - 0x15) < 2);
            cVar9 = pMVar67->ref_frame[0];
            if ((char)bVar37 < '\x01') {
              piVar34 = pMVar21->global_mvs + cVar9;
              if (uVar47 < pMVar21->ref_mv_count) {
                piVar34 = &pMVar21->ref_mv_stack[uVar47].this_mv;
              }
            }
            else {
              if ('\x04' < cVar9 || bVar37 < 5) {
                lVar51 = 0;
                do {
                  if (((&comp_ref0_lut)[lVar51] == cVar9) && ((&comp_ref1_lut)[lVar51] == bVar37))
                  break;
                  lVar51 = lVar51 + 1;
                } while (lVar51 != 9);
              }
              piVar34 = &pMVar21->ref_mv_stack[uVar47].comp_mv;
              if (bVar64) {
                piVar34 = &pMVar21->ref_mv_stack[uVar47].this_mv;
              }
            }
            local_68 = CONCAT44(local_68._4_4_,piVar34->as_int);
            in_stack_fffffffffffffed8 =
                 (MB_MODE_INFO *)CONCAT44((int)((ulong)in_stack_fffffffffffffed8 >> 0x20),uVar61);
            av1_encode_mv(cpi,(aom_writer *)pMVar49,td,(MV *)(pMVar50->mv + lVar31),(MV *)&local_68,
                          mvctx,uVar61);
            td = pTVar60;
            lVar31 = 1;
            bVar63 = (bool)('\0' < cVar57 & bVar64);
            bVar64 = false;
            pTVar60 = td;
          } while (bVar63);
        }
        else {
          if ((uVar53 == 0x15) || (uVar53 == 0x13)) {
            pMVar21 = (td->mb).mbmi_ext_frame;
            pMVar67 = *(td->mb).e_mbd.mi;
            bVar37 = pMVar67->ref_frame[1];
            uVar47 = (*(ushort *)&pMVar67->field_0xa7 >> 4 & 3) +
                     (uint)((byte)(pMVar67->mode - 0x15) < 2);
            cVar57 = pMVar67->ref_frame[0];
            if ((char)bVar37 < '\x01') {
              piVar34 = pMVar21->global_mvs + cVar57;
              if (uVar47 < pMVar21->ref_mv_count) {
                piVar34 = &pMVar21->ref_mv_stack[uVar47].this_mv;
              }
            }
            else {
              if ('\x04' < cVar57 || bVar37 < 5) {
                lVar31 = 0;
                do {
                  if (((&comp_ref0_lut)[lVar31] == cVar57) && ((&comp_ref1_lut)[lVar31] == bVar37))
                  break;
                  lVar31 = lVar31 + 1;
                } while (lVar31 != 9);
              }
              piVar34 = &pMVar21->ref_mv_stack[uVar47].comp_mv;
            }
            uVar18 = piVar34->as_int;
            mv = (MV *)(pMVar50->mv + 1);
          }
          else {
            if ((bVar38 & 0xfd) != 0x14) goto LAB_00195a21;
            pMVar21 = (td->mb).mbmi_ext_frame;
            pMVar67 = *(td->mb).e_mbd.mi;
            uVar47 = (*(ushort *)&pMVar67->field_0xa7 >> 4 & 3) +
                     (uint)((byte)(pMVar67->mode - 0x15) < 2);
            bVar37 = pMVar67->ref_frame[1];
            cVar57 = pMVar67->ref_frame[0];
            if ((char)bVar37 < '\x01') {
              piVar34 = pMVar21->global_mvs + cVar57;
              if (uVar47 < pMVar21->ref_mv_count) {
                piVar34 = &pMVar21->ref_mv_stack[uVar47].this_mv;
              }
            }
            else {
              if ('\x04' < cVar57 || bVar37 < 5) {
                lVar31 = 0;
                do {
                  if (((&comp_ref0_lut)[lVar31] == cVar57) && ((&comp_ref1_lut)[lVar31] == bVar37))
                  break;
                  lVar31 = lVar31 + 1;
                } while (lVar31 != 9);
              }
              piVar34 = &pMVar21->ref_mv_stack[uVar47].this_mv;
            }
            uVar18 = piVar34->as_int;
            mv = (MV *)pMVar50->mv;
          }
          local_68 = CONCAT44(local_68._4_4_,uVar18);
          in_stack_fffffffffffffed8 =
               (MB_MODE_INFO *)CONCAT44((int)((ulong)in_stack_fffffffffffffed8 >> 0x20),uVar61);
          av1_encode_mv(cpi,(aom_writer *)pMVar49,td,mv,(MV *)&local_68,&pFVar68->nmvc,uVar61);
          td = pTVar60;
          pTVar60 = td;
        }
      }
LAB_00195a21:
      pMVar67 = pMVar49;
      pFVar71 = pFVar68;
      if (((((cpi->common).current_frame.reference_mode == '\x01') ||
           (((cpi->common).seq_params)->enable_interintra_compound == '\0')) ||
          ((byte)(pMVar50->bsize - BLOCK_32X64) < 0xf9)) ||
         (((byte)(pMVar50->mode - 0x11) < 0xfc || (pMVar50->ref_frame[0] < '\x01')))) {
LAB_00195bf6:
        cVar57 = pMVar50->ref_frame[1];
        pMVar49 = pMVar67;
        pFVar68 = pFVar71;
        if (cVar57 != '\0') goto LAB_00195c03;
      }
      else {
        cVar57 = pMVar50->ref_frame[1];
        if (cVar57 < '\x01') {
          bVar37 = ""[BVar7];
          paaVar42 = pFVar68->interintra_cdf + bVar37;
          td = pTVar60;
          od_ec_encode_cdf_q15((od_ec_enc *)pMVar49->ref_frame,(uint)(cVar57 == '\0'),*paaVar42,2);
          if ((char)(pMVar49->wm_params).wmmat[5] != '\0') {
            uVar16 = (*paaVar42)[2];
            bVar38 = (char)(uVar16 >> 4) + 4;
            uVar17 = (*paaVar42)[0];
            if (cVar57 == '\0') {
              sVar58 = (short)((int)(0x8000 - (uint)uVar17) >> (bVar38 & 0x1f));
            }
            else {
              sVar58 = -(uVar17 >> (bVar38 & 0x1f));
            }
            (*paaVar42)[0] = uVar17 + sVar58;
            (*paaVar42)[2] = uVar16 + (uVar16 < 0x20);
          }
          pTVar60 = td;
          pFVar71 = pFVar68;
          if (cVar57 == '\0') {
            bVar38 = pMVar50->interintra_mode;
            icdf_03 = pFVar68->interintra_mode_cdf + bVar37;
            od_ec_encode_cdf_q15((od_ec_enc *)pMVar49->ref_frame,(uint)bVar38,*icdf_03,4);
            if ((char)(pMVar67->wm_params).wmmat[5] != '\0') {
              uVar16 = pFVar68->interintra_mode_cdf[bVar37][4];
              bVar35 = (char)(uVar16 >> 4) + 5;
              lVar31 = 0;
              do {
                uVar17 = (*icdf_03)[lVar31];
                if (lVar31 < (char)bVar38) {
                  sVar58 = (short)((int)(0x8000 - (uint)uVar17) >> (bVar35 & 0x1f));
                }
                else {
                  sVar58 = -(uVar17 >> (bVar35 & 0x1f));
                }
                (*icdf_03)[lVar31] = sVar58 + uVar17;
                lVar31 = lVar31 + 1;
              } while (lVar31 != 3);
              paVar69 = pFVar68->interintra_mode_cdf[bVar37] + 4;
              *paVar69 = *paVar69 + (ushort)(uVar16 < 0x20);
            }
            pTVar60 = td;
            if ((0 < av1_wedge_params_lookup[BVar7].wedge_types) &&
               (aom_write_symbol((aom_writer *)pMVar67,*(ushort *)&pMVar50->field_0xa7 >> 10 & 1,
                                 pFVar71->wedge_interintra_cdf[BVar7],2), pTVar60 = td,
               (pMVar50->field_0xa8 & 4) != 0)) {
              aom_write_symbol((aom_writer *)pMVar67,(int)pMVar50->interintra_wedge_index,
                               pFVar71->wedge_idx_cdf[0] + (ulong)BVar7 + (ulong)BVar7 * 0x10,0x10);
              pTVar60 = td;
            }
          }
          goto LAB_00195bf6;
        }
LAB_00195c03:
        if (((cpi->common).features.switchable_motion_mode == true) &&
           (pMVar50->overlappable_neighbors != '\0')) {
          iVar29 = (td->mb).e_mbd.cur_frame_force_integer_mv;
          BVar14 = pMVar50->bsize;
          if (iVar29 == 0) {
            bVar37 = block_size_high[BVar14];
            if (block_size_wide[BVar14] < block_size_high[BVar14]) {
              bVar37 = block_size_wide[BVar14];
            }
            if (((1 < (cpi->common).global_motion[pMVar50->ref_frame[0]].wmtype) &&
                ((pMVar50->mode - 0xf & 0xf7) == 0)) && (7 < bVar37)) goto LAB_00195e35;
          }
          else {
            bVar37 = block_size_high[BVar14];
            if (block_size_wide[BVar14] < block_size_high[BVar14]) {
              bVar37 = block_size_wide[BVar14];
            }
          }
          if (((7 < bVar37) && (cVar57 < '\0')) && (0xf3 < (byte)(pMVar50->mode - 0x19))) {
            if (((iVar29 == 0) && ((cpi->common).features.allow_warped_motion != false)) &&
               (pMVar50->num_proj_ref != '\0')) {
              psVar32 = (td->mb).e_mbd.block_ref_scale_factors[0];
              iVar29 = psVar32->x_scale_fp;
              if (((iVar29 == -1) || (iVar28 = psVar32->y_scale_fp, iVar28 == -1)) ||
                 (iVar28 == 0x4000 && iVar29 == 0x4000)) {
                bVar37 = pMVar50->motion_mode;
                pFVar68 = (td->mb).e_mbd.tile_ctx;
                paaVar56 = pFVar68->motion_mode_cdf + BVar14;
                td = pTVar60;
                pMVar49 = pMVar67;
                od_ec_encode_cdf_q15((od_ec_enc *)pMVar67->ref_frame,(uint)bVar37,*paaVar56,3);
                pWVar25 = &pMVar67->wm_params;
                pTVar60 = td;
                pMVar67 = pMVar49;
                if ((char)pWVar25->wmmat[5] != '\0') {
                  uVar16 = pFVar68->motion_mode_cdf[BVar14][3];
                  bVar38 = (char)(uVar16 >> 4) + 4;
                  lVar31 = 0;
                  do {
                    uVar17 = (*paaVar56)[lVar31];
                    if (lVar31 < (char)bVar37) {
                      sVar58 = (short)((int)(0x8000 - (uint)uVar17) >> (bVar38 & 0x1f));
                    }
                    else {
                      sVar58 = -(uVar17 >> (bVar38 & 0x1f));
                    }
                    (*paaVar56)[lVar31] = sVar58 + uVar17;
                    lVar31 = lVar31 + 1;
                  } while (lVar31 != 2);
                  paVar69 = pFVar68->motion_mode_cdf[BVar14] + 3;
                  *paVar69 = *paVar69 + (ushort)(uVar16 < 0x20);
                }
                goto LAB_00195e35;
              }
            }
            MVar15 = pMVar50->motion_mode;
            paaVar42 = ((td->mb).e_mbd.tile_ctx)->obmc_cdf + BVar14;
            td = pTVar60;
            pMVar49 = pMVar67;
            od_ec_encode_cdf_q15
                      ((od_ec_enc *)pMVar67->ref_frame,(uint)(MVar15 == '\x01'),*paaVar42,2);
            pWVar25 = &pMVar67->wm_params;
            pTVar60 = td;
            pMVar67 = pMVar49;
            if ((char)pWVar25->wmmat[5] != '\0') {
              uVar16 = (*paaVar42)[2];
              bVar37 = (char)(uVar16 >> 4) + 4;
              uVar17 = (*paaVar42)[0];
              if (MVar15 == '\x01') {
                sVar58 = (short)((int)(0x8000 - (uint)uVar17) >> (bVar37 & 0x1f));
              }
              else {
                sVar58 = -(uVar17 >> (bVar37 & 0x1f));
              }
              (*paaVar42)[0] = sVar58 + uVar17;
              (*paaVar42)[2] = uVar16 + (uVar16 < 0x20);
            }
          }
        }
LAB_00195e35:
        pMVar49 = pMVar67;
        pFVar68 = pFVar71;
        if ('\0' < pMVar50->ref_frame[1]) {
          bVar37 = block_size_high[BVar7];
          if (block_size_wide[BVar7] < block_size_high[BVar7]) {
            bVar37 = block_size_wide[BVar7];
          }
          pMVar66 = pMVar67;
          pFVar70 = pFVar71;
          if (bVar37 < 8) {
            uVar16 = *(ushort *)&pMVar50->field_0xa7;
            if ((uVar16 >> 8 & 1) == 0) {
LAB_00195f95:
              pSVar20 = (cpi->common).seq_params;
              pMVar49 = pMVar66;
              pFVar68 = pFVar70;
              if ((pSVar20->order_hint_info).enable_dist_wtd_comp != 0) {
                pMVar50 = *(td->mb).e_mbd.mi;
                bVar37 = pMVar50->ref_frame[0];
                if ((byte)(bVar37 - 1) < 8) {
                  lVar31 = (long)(cpi->common).remapped_ref_idx[bVar37 - 1];
                  if (lVar31 == -1) {
                    pRVar40 = (RefCntBuffer *)0x0;
                  }
                  else {
                    pRVar40 = (cpi->common).ref_frame_map[lVar31];
                  }
                }
                else {
                  pRVar40 = (RefCntBuffer *)0x0;
                }
                bVar37 = pMVar50->ref_frame[1];
                uVar47 = 0;
                if (((byte)(bVar37 - 1) < 8) &&
                   (lVar31 = (long)(cpi->common).remapped_ref_idx[bVar37 - 1], lVar31 != -1)) {
                  pRVar44 = (cpi->common).ref_frame_map[lVar31];
                }
                else {
                  pRVar44 = (RefCntBuffer *)0x0;
                }
                if (pRVar40 != (RefCntBuffer *)0x0) {
                  uVar47 = pRVar40->order_hint;
                }
                iVar29 = 0;
                uVar53 = 0;
                if (pRVar44 != (RefCntBuffer *)0x0) {
                  uVar53 = pRVar44->order_hint;
                }
                iVar28 = 0;
                if ((pSVar20->order_hint_info).enable_order_hint != 0) {
                  uVar61 = ((cpi->common).cur_frame)->order_hint;
                  uVar53 = uVar53 - uVar61;
                  uVar48 = 1 << ((byte)(pSVar20->order_hint_info).order_hint_bits_minus_1 & 0x1f);
                  iVar29 = (uVar48 - 1 & uVar53) - (uVar53 & uVar48);
                  uVar61 = uVar61 - uVar47;
                  iVar28 = (uVar48 - 1 & uVar61) - (uVar61 & uVar48);
                }
                pMVar50 = (td->mb).e_mbd.left_mbmi;
                pMVar67 = (td->mb).e_mbd.above_mbmi;
                if (pMVar67 == (MB_MODE_INFO *)0x0) {
                  uVar43 = 0;
                }
                else if (pMVar67->ref_frame[1] < '\x01') {
                  uVar43 = (ulong)(pMVar67->ref_frame[0] == '\a');
                }
                else {
                  uVar43 = (ulong)(*(ushort *)&pMVar67->field_0xa7 >> 9 & 1);
                }
                if (pMVar50 == (MB_MODE_INFO *)0x0) {
                  uVar41 = 0;
                }
                else if (pMVar50->ref_frame[1] < '\x01') {
                  uVar41 = (ulong)(pMVar50->ref_frame[0] == '\a');
                }
                else {
                  uVar41 = (ulong)(*(ushort *)&pMVar50->field_0xa7 >> 9 & 1);
                }
                iVar30 = -iVar29;
                if (0 < iVar29) {
                  iVar30 = iVar29;
                }
                iVar29 = -iVar28;
                if (0 < iVar28) {
                  iVar29 = iVar28;
                }
                lVar31 = uVar43 + uVar41 + (ulong)(iVar30 == iVar29) * 3;
                uVar47 = uVar16 >> 9 & 1;
                paaVar42 = pFVar70->compound_index_cdf + lVar31;
                td = pTVar60;
                od_ec_encode_cdf_q15((od_ec_enc *)pMVar66->ref_frame,uVar47,*paaVar42,2);
                pTVar60 = td;
                if ((char)(pMVar66->wm_params).wmmat[5] != '\0') {
                  uVar16 = pFVar70->compound_index_cdf[lVar31][2];
                  bVar37 = (char)(uVar16 >> 4) + 4;
                  uVar17 = (*paaVar42)[0];
                  if ((short)uVar47 == 0) {
                    sVar58 = -(uVar17 >> (bVar37 & 0x1f));
                  }
                  else {
                    sVar58 = (short)((int)(0x8000 - (uint)uVar17) >> (bVar37 & 0x1f));
                  }
                  (*paaVar42)[0] = uVar17 + sVar58;
                  pFVar70->compound_index_cdf[lVar31][2] = uVar16 + (uVar16 < 0x20);
                }
              }
              goto LAB_001962dc;
            }
          }
          else {
            if (((cpi->common).seq_params)->enable_masked_compound != '\0') {
              pMVar49 = (td->mb).e_mbd.left_mbmi;
              pMVar22 = (td->mb).e_mbd.above_mbmi;
              uVar53 = 0;
              uVar47 = 0;
              if (pMVar22 != (MB_MODE_INFO *)0x0) {
                if (pMVar22->ref_frame[1] < '\x01') {
                  uVar47 = (uint)(pMVar22->ref_frame[0] == '\a') * 3;
                }
                else {
                  uVar47 = *(ushort *)&pMVar22->field_0xa7 >> 8 & 1;
                }
              }
              if (pMVar49 != (MB_MODE_INFO *)0x0) {
                if (pMVar49->ref_frame[1] < '\x01') {
                  uVar53 = (uint)(pMVar49->ref_frame[0] == '\a') * 3;
                }
                else {
                  uVar53 = *(ushort *)&pMVar49->field_0xa7 >> 8 & 1;
                }
              }
              uVar43 = 5;
              if (uVar53 + uVar47 < 5) {
                uVar43 = (ulong)(uVar53 + uVar47);
              }
              uVar47 = *(ushort *)&pMVar50->field_0xa7 >> 8 & 1;
              paaVar42 = pFVar71->comp_group_idx_cdf + uVar43;
              td = pTVar60;
              od_ec_encode_cdf_q15((od_ec_enc *)pMVar67->ref_frame,uVar47,*paaVar42,2);
              pTVar60 = td;
              if ((char)(pMVar67->wm_params).wmmat[5] != '\0') {
                uVar16 = pFVar71->comp_group_idx_cdf[uVar43][2];
                bVar37 = (char)(uVar16 >> 4) + 4;
                uVar17 = (*paaVar42)[0];
                if ((short)uVar47 == 0) {
                  sVar58 = -(uVar17 >> (bVar37 & 0x1f));
                }
                else {
                  sVar58 = (short)((int)(0x8000 - (uint)uVar17) >> (bVar37 & 0x1f));
                }
                (*paaVar42)[0] = sVar58 + uVar17;
                pFVar71->comp_group_idx_cdf[uVar43][2] = uVar16 + (uVar16 < 0x20);
              }
            }
            uVar16 = *(ushort *)&pMVar50->field_0xa7;
            if ((uVar16 >> 8 & 1) == 0) goto LAB_00195f95;
            pMVar67 = pMVar66;
            pFVar71 = pFVar70;
            if (0 < av1_wedge_params_lookup[BVar7].wedge_types) {
              iVar29 = (pMVar50->interinter_comp).type - 2;
              paaVar42 = pFVar70->compound_type_cdf + BVar7;
              od_ec_encode_cdf_q15((od_ec_enc *)pMVar66->ref_frame,iVar29,*paaVar42,2);
              if ((char)(pMVar66->wm_params).wmmat[5] != '\0') {
                uVar16 = pFVar70->compound_type_cdf[BVar7][2];
                bVar37 = (char)(uVar16 >> 4) + 4;
                uVar17 = (*paaVar42)[0];
                if ((char)iVar29 < '\x01') {
                  sVar58 = -(uVar17 >> (bVar37 & 0x1f));
                }
                else {
                  sVar58 = (short)((int)(0x8000 - (uint)uVar17) >> (bVar37 & 0x1f));
                }
                (*paaVar42)[0] = sVar58 + uVar17;
                pFVar70->compound_type_cdf[BVar7][2] = uVar16 + (uVar16 < 0x20);
              }
            }
          }
          pMVar49 = pMVar67;
          if ((pMVar50->interinter_comp).type == '\x02') {
            iVar29 = (int)(pMVar50->interinter_comp).wedge_index;
            uVar43 = (ulong)BVar7;
            paVar69 = pFVar71->wedge_idx_cdf[0] + (ulong)BVar7 + uVar43 * 0x10;
            pFVar68 = pFVar71;
            od_ec_encode_cdf_q15((od_ec_enc *)pMVar67->ref_frame,iVar29,paVar69,0x10);
            if ((char)(pMVar67->wm_params).wmmat[5] != '\0') {
              uVar16 = pFVar71->wedge_idx_cdf[0][(ulong)BVar7 + uVar43 * 0x10 + 0x10];
              bVar37 = (char)(uVar16 >> 4) + 5;
              lVar31 = 0;
              do {
                uVar17 = paVar69[lVar31];
                if (lVar31 < iVar29) {
                  sVar58 = (short)((int)(0x8000 - (uint)uVar17) >> (bVar37 & 0x1f));
                }
                else {
                  sVar58 = -(uVar17 >> (bVar37 & 0x1f));
                }
                paVar69[lVar31] = sVar58 + uVar17;
                lVar31 = lVar31 + 1;
              } while (lVar31 != 0xf);
              paVar69 = pFVar71->wedge_idx_cdf[0] + (ulong)BVar7 + uVar43 * 0x10 + 0x10;
              *paVar69 = *paVar69 + (ushort)(uVar16 < 0x20);
            }
            uVar47 = (uint)(pMVar50->interinter_comp).wedge_sign;
            td = pTVar60;
            pFVar71 = pFVar68;
          }
          else {
            uVar47 = (pMVar50->interinter_comp).mask_type & 1;
            td = pTVar60;
          }
          od_ec_encode_bool_q15((od_ec_enc *)pMVar67->ref_frame,uVar47,0x4000);
          pTVar60 = td;
          pFVar68 = pFVar71;
        }
      }
LAB_001962dc:
      pMVar50 = *(td->mb).e_mbd.mi;
      if (((pMVar50->field_0xa7 & 0x40) == 0) && (pMVar50->motion_mode != '\x02')) {
        pFVar71 = (td->mb).e_mbd.tile_ctx;
        if ((pMVar50->mode == '\x17') || (pMVar50->mode == '\x0f')) {
          bVar37 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [pMVar50->bsize];
          if ("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
              [pMVar50->bsize] <
              "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
              [pMVar50->bsize]) {
            bVar37 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                     [pMVar50->bsize];
          }
          if (1 < bVar37) {
            cVar57 = '\x01';
            lVar31 = 0;
            do {
              if ((td->mb).e_mbd.global_motion[pMVar50->ref_frame[lVar31]].wmtype == '\x01')
              goto LAB_0019633c;
              lVar31 = 1;
              bVar64 = cVar57 == -1;
              cVar57 = '\0';
            } while (bVar64 && '\0' < pMVar50->ref_frame[1]);
            goto LAB_00193eed;
          }
        }
LAB_0019633c:
        if ((cpi->common).features.interp_filter == MULTITAP_SHARP2) {
          pMVar33 = pMVar49->ref_frame;
          iVar29 = 0;
          bVar64 = true;
          td = pTVar60;
          do {
            iVar29 = av1_get_pred_context_switchable_interp(xd_00,iVar29);
            bVar37 = (byte)((pMVar50->interp_filters).as_int >> 0x10);
            if (bVar64) {
              bVar37 = (byte)(pMVar50->interp_filters).as_int;
            }
            paaVar56 = pFVar71->switchable_interp_cdf + iVar29;
            od_ec_encode_cdf_q15((od_ec_enc *)pMVar33,(uint)bVar37,*paaVar56,3);
            if ((char)(pMVar49->wm_params).wmmat[5] != '\0') {
              uVar16 = (*paaVar56)[3];
              bVar38 = (char)(uVar16 >> 4) + 4;
              lVar31 = 0;
              do {
                uVar17 = (*paaVar56)[lVar31];
                if (lVar31 < (char)bVar37) {
                  sVar58 = (short)((int)(0x8000 - (uint)uVar17) >> (bVar38 & 0x1f));
                }
                else {
                  sVar58 = -(uVar17 >> (bVar38 & 0x1f));
                }
                (*paaVar56)[lVar31] = sVar58 + uVar17;
                lVar31 = lVar31 + 1;
              } while (lVar31 != 2);
              (*paaVar56)[3] = (*paaVar56)[3] + (ushort)(uVar16 < 0x20);
            }
            td->interp_filter_selected[bVar37] = td->interp_filter_selected[bVar37] + 1;
            iVar29 = 1;
            bVar63 = (bool)(bVar64 & ((cpi->common).seq_params)->enable_dual_filter != '\0');
            bVar64 = false;
            pTVar60 = td;
          } while (bVar63);
        }
      }
    }
  }
LAB_00193eed:
  local_50 = (MB_MODE_INFO_EXT_FRAME *)(td->mb).e_mbd.plane;
  pMVar33 = pMVar49->ref_frame;
  bVar37 = 1;
  lVar51 = 0x26d8;
  bVar38 = 0;
  lVar31 = 0;
  paVar69 = pFVar68[-1].cfl_alpha_cdf[0] + 0xe;
  do {
    bVar35 = (pMVar19->palette_mode_info).palette_size[lVar31];
    uVar43 = (ulong)bVar35;
    token_stats = paVar69;
    if (bVar35 != 0) {
      bVar36 = block_size_wide[pMVar19->bsize];
      iVar29 = (td->mb).e_mbd.mb_to_right_edge;
      bVar10 = (byte)((macroblockd_plane *)((long)local_50 + lVar31 * 0xa30))->subsampling_x;
      bVar11 = (byte)((macroblockd_plane *)((long)local_50 + lVar31 * 0xa30))->subsampling_y;
      bVar12 = block_size_high[pMVar19->bsize];
      iVar28 = (td->mb).e_mbd.mb_to_bottom_edge;
      bVar23 = bVar11 & 0x1f;
      pTVar59 = *tok;
      uVar47 = 0x1f;
      if (bVar35 != 0) {
        for (; bVar35 >> uVar47 == 0; uVar47 = uVar47 - 1) {
        }
      }
      uVar61 = uVar47 ^ 0x1f;
      uVar53 = (byte)*pTVar59 & 7;
      iVar30 = (1 << (-(char)uVar61 & 0x1fU)) - (uint)bVar35;
      if ((int)uVar53 < iVar30) {
        td = pTVar60;
        if (uVar61 != 0x1f) {
          uVar47 = uVar47 + 1;
          do {
            od_ec_encode_bool_q15
                      ((od_ec_enc *)pMVar33,(uint)((uVar53 >> (uVar47 - 2 & 0x1f) & 1) != 0),0x4000)
            ;
            uVar47 = uVar47 - 1;
            td = pTVar60;
          } while (1 < uVar47);
        }
      }
      else {
        if (uVar61 != 0x1f) {
          uVar47 = uVar47 + 1;
          do {
            od_ec_encode_bool_q15
                      ((od_ec_enc *)pMVar33,
                       (uint)(((uint)(((int)(uVar53 - iVar30) >> 1) + iVar30) >> (uVar47 - 2 & 0x1f)
                              & 1) != 0),0x4000);
            uVar47 = uVar47 - 1;
          } while (1 < uVar47);
        }
        od_ec_encode_bool_q15((od_ec_enc *)pMVar33,uVar53 - iVar30 & 1,0x4000);
        td = pTVar60;
      }
      iVar29 = (((int)((iVar29 >> 0x1f & iVar29 >> 3) + (uint)bVar36) >> (bVar10 & 0x1f)) +
               (uint)(bVar36 >> (bVar10 & 0x1f) < 4 & bVar38) * 2) *
               (((int)((iVar28 >> 0x1f & iVar28 >> 3) + (uint)bVar12) >> bVar23) +
               (uint)(bVar12 >> (bVar11 & 0x1f) < 4 & bVar38) * 2);
      pTVar59 = pTVar59 + 1;
      token_stats = paVar69;
      if (1 < iVar29) {
        uVar47 = 2;
        if (2 < bVar35) {
          uVar47 = (uint)bVar35;
        }
        iVar28 = 0 >> bVar23;
        do {
          icdf = (uint16_t *)
                 ((long)paVar69 + (long)((char)*pTVar59 >> 4) * 0x12 + uVar43 * 0x5a + lVar51);
          uVar53 = (byte)*pTVar59 & 7;
          od_ec_encode_cdf_q15((od_ec_enc *)pMVar33,uVar53,icdf,(uint)bVar35);
          if ((char)(pMVar49->wm_params).wmmat[5] != '\0') {
            uVar16 = icdf[uVar43];
            bVar38 = (char)(uVar16 >> 4) + (3 < bVar35) + 4;
            uVar41 = 0;
            do {
              uVar17 = icdf[uVar41];
              if (uVar41 < uVar53) {
                sVar58 = (short)((int)(0x8000 - (uint)uVar17) >> (bVar38 & 0x1f));
              }
              else {
                sVar58 = -(uVar17 >> (bVar38 & 0x1f));
              }
              icdf[uVar41] = sVar58 + uVar17;
              uVar41 = uVar41 + 1;
            } while (uVar47 - 1 != uVar41);
            icdf[uVar43] = icdf[uVar43] + (ushort)(uVar16 < 0x20);
          }
          pTVar59 = pTVar59 + 1;
          bVar64 = iVar28 != iVar29 + -2;
          iVar28 = iVar28 + 1;
        } while (bVar64);
      }
      *tok = pTVar59;
      pTVar60 = td;
    }
    lVar31 = 1;
    lVar51 = 0x294e;
    bVar38 = 1;
    bVar64 = (bool)(((cpi->common).seq_params)->monochrome == '\0' & bVar37);
    bVar37 = 0;
    paVar69 = token_stats;
  } while (bVar64);
  bVar64 = true;
  if (-1 < (char)*(ushort *)&pMVar19->field_0xa7) {
    bVar64 = '\0' < pMVar19->ref_frame[0];
  }
  if (((bool)(pMVar19->skip_txfm != '\0' & bVar64 |
             (local_58 == 0 || (cpi->common).features.tx_mode != '\x02'))) ||
     ((td->mb).e_mbd.lossless[*(ushort *)&pMVar19->field_0xa7 & 7] != 0)) {
    bVar37 = (td->mb).e_mbd.width;
    bVar6 = (td->mb).e_mbd.height;
    bVar64 = (bool)(pMVar19->skip_txfm != '\0' & bVar64);
    if (bVar64) {
      uVar47 = (uint)(byte)(bVar6 * '\x04');
    }
    else {
      uVar47 = tx_size_high[pMVar19->tx_size];
    }
    if ((ulong)bVar37 != 0) {
      if (bVar64) {
        uVar53 = (uint)bVar37 * 4 & 0xff;
      }
      else {
        uVar53 = tx_size_wide[pMVar19->tx_size];
      }
      memset((pTVar60->mb).e_mbd.above_txfm_context,uVar53,(ulong)bVar37);
    }
  }
  else {
    pMVar50 = *(td->mb).e_mbd.mi;
    if (bVar64) {
      iVar29 = 0;
      uVar47 = 0;
      if ((td->mb).e_mbd.lossless[*(ushort *)&pMVar50->field_0xa7 & 7] == 0) {
        uVar47 = (uint)""[local_58];
      }
      iVar28 = *(int *)((long)tx_size_high_unit + (ulong)(uVar47 << 2));
      iVar30 = *(int *)((long)tx_size_wide_unit + (ulong)(uVar47 << 2));
      do {
        iVar62 = 0;
        do {
          in_stack_fffffffffffffed8 = pMVar49;
          pMVar49 = in_stack_fffffffffffffed8;
          write_tx_size_vartx(xd_00,pMVar19,(TX_SIZE)uVar47,0,iVar29,iVar62,
                              (aom_writer *)in_stack_fffffffffffffed8);
          iVar62 = iVar62 + iVar30;
        } while (iVar62 < (int)(uint)bVar6);
        iVar29 = iVar29 + iVar28;
      } while (iVar29 < (int)local_48);
      goto LAB_001942fb;
    }
    uVar43 = (ulong)pMVar50->bsize;
    if (uVar43 != 0) {
      bVar6 = ""[uVar43];
      uVar47 = (uint)bVar6;
      _Var8 = (td->mb).e_mbd.up_available;
      _Var13 = (td->mb).e_mbd.left_available;
      bVar37 = *(td->mb).e_mbd.above_txfm_context;
      if ((_Var8 == true) &&
         ((pMVar67 = (td->mb).e_mbd.above_mbmi, (pMVar67->field_0xa7 & 0x80) != 0 ||
          ('\0' < pMVar67->ref_frame[0])))) {
        bVar37 = block_size_wide[pMVar67->bsize];
      }
      bVar38 = *(td->mb).e_mbd.left_txfm_context;
      if ((_Var13 != false) &&
         ((pMVar67 = (pTVar60->mb).e_mbd.left_mbmi, (pMVar67->field_0xa7 & 0x80) != 0 ||
          ('\0' < pMVar67->ref_frame[0])))) {
        bVar38 = block_size_high[pMVar67->bsize];
      }
      iVar29 = 0;
      if (bVar6 != pMVar50->tx_size) {
        iVar29 = 0;
        do {
          iVar29 = iVar29 + 1;
          bVar6 = ""[bVar6];
        } while (bVar6 != pMVar50->tx_size);
      }
      bVar6 = bsize_to_max_depth_bsize_to_max_depth_table[uVar43];
      paaVar56 = ((pTVar60->mb).e_mbd.tile_ctx)->tx_size_cdf
                 [(ulong)(byte)bsize_to_tx_size_cat_bsize_to_tx_size_depth_table[uVar43] - 1] +
                 (ulong)(byte)(_Var8 & *(int *)((long)tx_size_wide + (ulong)(uVar47 * 4)) <=
                                       (int)(uint)bVar37) +
                 (ulong)(byte)(_Var13 & *(int *)((long)tx_size_high + (ulong)(uVar47 * 4)) <=
                                        (int)(uint)bVar38);
      td = pTVar60;
      od_ec_encode_cdf_q15((od_ec_enc *)pMVar33,iVar29,*paaVar56,bVar6 + 1);
      pTVar60 = td;
      if ((char)(pMVar49->wm_params).wmmat[5] != '\0') {
        uVar16 = (*paaVar56)[(ulong)bVar6 + 1];
        bVar37 = (char)(uVar16 >> 4) + 4;
        uVar43 = 0;
        do {
          uVar17 = (*paaVar56)[uVar43];
          if ((long)uVar43 < (long)(char)iVar29) {
            sVar58 = (short)((int)(0x8000 - (uint)uVar17) >> (bVar37 & 0x1f));
          }
          else {
            sVar58 = -(uVar17 >> (bVar37 & 0x1f));
          }
          (*paaVar56)[uVar43] = sVar58 + uVar17;
          uVar43 = uVar43 + 1;
        } while ((uint)bVar6 + (uint)(bVar6 == 0) != uVar43);
        (*paaVar56)[(ulong)bVar6 + 1] = (*paaVar56)[(ulong)bVar6 + 1] + (ushort)(uVar16 < 0x20);
      }
    }
    uVar43 = (ulong)(td->mb).e_mbd.width;
    bVar6 = (td->mb).e_mbd.height;
    uVar47 = (uint)*(byte *)(tx_size_high + pMVar19->tx_size);
    if (uVar43 != 0) {
      memset((td->mb).e_mbd.above_txfm_context,tx_size_wide[pMVar19->tx_size],uVar43);
    }
  }
  if (bVar6 != 0) {
    memset((pTVar60->mb).e_mbd.left_txfm_context,uVar47 & 0xff,(ulong)bVar6);
  }
LAB_001942fb:
  if (pMVar19->skip_txfm == '\0') {
    local_34 = aom_tell_size((aom_writer *)pMVar49);
    pMVar19 = *(pTVar60->mb).e_mbd.mi;
    BVar7 = pMVar19->bsize;
    if (((pMVar19->field_0xa7 & 0x80) != 0) || ('\0' < pMVar19->ref_frame[0])) {
      local_60 = 0;
      local_68 = 0;
      bVar37 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar7];
      local_58 = CONCAT44(local_58._4_4_,(uint)bVar37);
      uVar47 = 0x10;
      if (bVar37 < 0x10) {
        uVar47 = (uint)bVar37;
      }
      local_40 = CONCAT44(local_40._4_4_,uVar47);
      bVar37 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar7];
      uVar47 = 0x10;
      if (bVar37 < 0x10) {
        uVar47 = (uint)bVar37;
      }
      local_48 = CONCAT71(local_48._1_7_,((cpi->common).seq_params)->monochrome);
      uVar53 = 0;
      iVar29 = 0;
      pTVar65 = pTVar60;
      pMVar50 = pMVar49;
LAB_001943d4:
      token_stats = (aom_cdf_prob *)((ulong)token_stats & 0xffffffff00000000);
LAB_001943dc:
      xd_01 = (MACROBLOCKD *)0x0;
      do {
        if (xd_01 == (MACROBLOCKD *)0x0) {
          iVar28 = (pTVar60->mb).e_mbd.plane[0].subsampling_x;
          iVar30 = (pTVar60->mb).e_mbd.plane[0].subsampling_y;
          BVar7 = av1_ss_size_lookup[pMVar19->bsize][iVar28][iVar30];
          uVar61 = 0;
          if ((pTVar60->mb).e_mbd.lossless[*(ushort *)&(*(pTVar60->mb).e_mbd.mi)->field_0xa7 & 7] ==
              0) {
            uVar61 = (uint)""[BVar7];
          }
          bVar6 = *(byte *)((long)iVar30 + (long)iVar28 * 2 + 0x511f90);
          uVar45 = uVar53 >> ((byte)iVar30 & 0x1f);
          uVar48 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [bVar6] + uVar45;
          if ((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                         [BVar7] <=
              (int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                    [bVar6] + uVar45)) {
            uVar48 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                           [BVar7];
          }
          aVar52 = (uint)token_stats >> ((byte)iVar28 & 0x1f);
          aVar46 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [bVar6] + aVar52;
          if ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                         [BVar7] <=
              (int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [bVar6] + aVar52)) {
            aVar46 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                           [BVar7];
          }
          if (uVar45 < uVar48) {
            iVar28 = *(int *)((long)tx_size_wide_unit + (ulong)(uVar61 << 2));
            iVar30 = *(int *)((long)tx_size_high_unit + (ulong)(uVar61 << 2));
            do {
              aVar55 = aVar52;
              if (aVar52 < aVar46) {
                do {
                  in_stack_fffffffffffffed8 =
                       (MB_MODE_INFO *)
                       CONCAT44((int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(uint)BVar7);
                  pack_txb_tokens((aom_writer *)pMVar49,cm,&pTVar60->mb,(TokenExtra **)xd_00,
                                  (TokenExtra *)pMVar19,(MACROBLOCKD *)0x0,in_stack_fffffffffffffed8
                                  ,iVar29,(BLOCK_SIZE)uVar45,aVar55,uVar61,(int)pTVar65,(int)pMVar50
                                  ,BVar7,(TOKEN_STATS *)token_stats);
                  pMVar49 = pMVar50;
                  pTVar60 = pTVar65;
                  iVar29 = iVar29 + iVar30 * iVar28;
                  aVar55 = aVar55 + iVar28;
                  pTVar65 = pTVar60;
                  pMVar50 = pMVar49;
                } while ((int)aVar55 < (int)aVar46);
              }
              uVar45 = uVar45 + iVar30;
            } while ((int)uVar45 < (int)uVar48);
          }
        }
        else {
          if ((pTVar60->mb).e_mbd.is_chroma_ref != true) goto LAB_001947ba;
          iVar28 = ((macroblockd_plane *)((long)local_50 + xd_01 * 0xa30))->subsampling_x;
          iVar30 = ((macroblockd_plane *)((long)local_50 + xd_01 * 0xa30))->subsampling_y;
          BVar7 = av1_ss_size_lookup[pMVar19->bsize][iVar28][iVar30];
          uVar61 = 0;
          if ((pTVar60->mb).e_mbd.lossless[*(ushort *)&(*(pTVar60->mb).e_mbd.mi)->field_0xa7 & 7] ==
              0) {
            bVar6 = ""[BVar7];
            uVar48 = (uint)bVar6;
            if (bVar6 < 0x11) {
              uVar61 = 3;
              if ((1 < bVar6 - 0xb) && (uVar48 != 4)) {
LAB_001947a2:
                uVar61 = uVar48;
              }
            }
            else if (bVar6 == 0x11) {
              uVar61 = 9;
            }
            else {
              if (uVar48 != 0x12) goto LAB_001947a2;
              uVar61 = 10;
            }
          }
          bVar6 = *(byte *)((long)iVar30 + (long)iVar28 * 2 + 0x511f90);
          uVar45 = uVar53 >> ((byte)iVar30 & 0x1f);
          uVar48 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [bVar6] + uVar45;
          if ((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                         [BVar7] <=
              (int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                    [bVar6] + uVar45)) {
            uVar48 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                           [BVar7];
          }
          aVar52 = (uint)token_stats >> ((byte)iVar28 & 0x1f);
          aVar46 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [bVar6] + aVar52;
          if ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                         [BVar7] <=
              (int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [bVar6] + aVar52)) {
            aVar46 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                           [BVar7];
          }
          if (uVar45 < uVar48) {
            iVar28 = *(int *)((long)tx_size_wide_unit + (ulong)(uVar61 << 2));
            iVar30 = *(int *)((long)tx_size_high_unit + (ulong)(uVar61 << 2));
            do {
              if (aVar52 < aVar46) {
                iVar62 = *(int *)((long)&local_68 + (long)xd_01 * 4);
                aVar55 = aVar52;
                do {
                  in_stack_fffffffffffffed8 =
                       (MB_MODE_INFO *)
                       CONCAT44((int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(uint)BVar7);
                  pack_txb_tokens((aom_writer *)pMVar49,cm,&pTVar60->mb,(TokenExtra **)xd_00,
                                  (TokenExtra *)pMVar19,xd_01,in_stack_fffffffffffffed8,iVar62,
                                  (BLOCK_SIZE)uVar45,aVar55,uVar61,(int)pTVar65,(int)pMVar50,
                                  (TX_SIZE)uVar61,(TOKEN_STATS *)token_stats);
                  pMVar49 = pMVar50;
                  pTVar60 = pTVar65;
                  iVar62 = iVar62 + iVar30 * iVar28;
                  *(int *)((long)&local_68 + (long)xd_01 * 4) = iVar62;
                  aVar55 = aVar55 + iVar28;
                  pTVar65 = pTVar60;
                  pMVar50 = pMVar49;
                } while ((int)aVar55 < (int)aVar46);
              }
              uVar45 = uVar45 + iVar30;
            } while ((int)uVar45 < (int)uVar48);
          }
        }
        if (((char)local_48 != '\0') ||
           (bVar64 = (MACROBLOCKD *)0x1 < xd_01, xd_01 = (MACROBLOCKD *)((long)&xd_01->mi_row + 1),
           bVar64)) goto LAB_001947ba;
      } while( true );
    }
    av1_write_intra_coeffs_mb(cm,&pTVar60->mb,(aom_writer *)pMVar49,BVar7);
    pTVar65 = pTVar60;
LAB_001947fa:
    iVar29 = aom_tell_size((aom_writer *)pMVar49);
    pTVar65->coefficient_size = pTVar65->coefficient_size + (iVar29 - local_34);
  }
  return;
LAB_001947ba:
  uVar61 = (int)token_stats + (int)local_40;
  token_stats = (aom_cdf_prob *)CONCAT44((int)((ulong)token_stats >> 0x20),uVar61);
  if ((uint)local_58 <= uVar61) goto code_r0x001947d6;
  goto LAB_001943dc;
code_r0x001947d6:
  uVar53 = uVar53 + uVar47;
  if (bVar37 <= uVar53) goto LAB_001947fa;
  goto LAB_001943d4;
}

Assistant:

static inline void write_modes_b(AV1_COMP *cpi, ThreadData *const td,
                                 const TileInfo *const tile, aom_writer *w,
                                 const TokenExtra **tok,
                                 const TokenExtra *const tok_end, int mi_row,
                                 int mi_col) {
  const AV1_COMMON *cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  MACROBLOCKD *xd = &td->mb.e_mbd;
  FRAME_CONTEXT *tile_ctx = xd->tile_ctx;
  const int grid_idx = mi_row * mi_params->mi_stride + mi_col;
  xd->mi = mi_params->mi_grid_base + grid_idx;
  td->mb.mbmi_ext_frame =
      cpi->mbmi_ext_info.frame_base +
      get_mi_ext_idx(mi_row, mi_col, cm->mi_params.mi_alloc_bsize,
                     cpi->mbmi_ext_info.stride);
  xd->tx_type_map = mi_params->tx_type_map + grid_idx;
  xd->tx_type_map_stride = mi_params->mi_stride;

  const MB_MODE_INFO *mbmi = xd->mi[0];
  const BLOCK_SIZE bsize = mbmi->bsize;
  assert(bsize <= cm->seq_params->sb_size ||
         (bsize >= BLOCK_SIZES && bsize < BLOCK_SIZES_ALL));

  const int bh = mi_size_high[bsize];
  const int bw = mi_size_wide[bsize];
  set_mi_row_col(xd, tile, mi_row, bh, mi_col, bw, mi_params->mi_rows,
                 mi_params->mi_cols);

  xd->above_txfm_context = cm->above_contexts.txfm[tile->tile_row] + mi_col;
  xd->left_txfm_context =
      xd->left_txfm_context_buffer + (mi_row & MAX_MIB_MASK);

  write_mbmi_b(cpi, td, w);

  for (int plane = 0; plane < AOMMIN(2, av1_num_planes(cm)); ++plane) {
    const uint8_t palette_size_plane =
        mbmi->palette_mode_info.palette_size[plane];
    assert(!mbmi->skip_mode || !palette_size_plane);
    if (palette_size_plane > 0) {
      assert(mbmi->use_intrabc == 0);
      assert(av1_allow_palette(cm->features.allow_screen_content_tools,
                               mbmi->bsize));
      assert(!plane || xd->is_chroma_ref);
      int rows, cols;
      av1_get_block_dimensions(mbmi->bsize, plane, xd, NULL, NULL, &rows,
                               &cols);
      assert(*tok < tok_end);
      MapCdf map_pb_cdf = plane ? tile_ctx->palette_uv_color_index_cdf
                                : tile_ctx->palette_y_color_index_cdf;
      pack_map_tokens(w, tok, palette_size_plane, rows * cols, map_pb_cdf);
    }
  }

  const int is_inter_tx = is_inter_block(mbmi);
  const int skip_txfm = mbmi->skip_txfm;
  const uint8_t segment_id = mbmi->segment_id;
  if (cm->features.tx_mode == TX_MODE_SELECT && block_signals_txsize(bsize) &&
      !(is_inter_tx && skip_txfm) && !xd->lossless[segment_id]) {
    if (is_inter_tx) {  // This implies skip flag is 0.
      const TX_SIZE max_tx_size = get_vartx_max_txsize(xd, bsize, 0);
      const int txbh = tx_size_high_unit[max_tx_size];
      const int txbw = tx_size_wide_unit[max_tx_size];
      const int width = mi_size_wide[bsize];
      const int height = mi_size_high[bsize];
      for (int idy = 0; idy < height; idy += txbh) {
        for (int idx = 0; idx < width; idx += txbw) {
          write_tx_size_vartx(xd, mbmi, max_tx_size, 0, idy, idx, w);
        }
      }
    } else {
      write_selected_tx_size(xd, w);
      set_txfm_ctxs(mbmi->tx_size, xd->width, xd->height, 0, xd);
    }
  } else {
    set_txfm_ctxs(mbmi->tx_size, xd->width, xd->height,
                  skip_txfm && is_inter_tx, xd);
  }

  if (!mbmi->skip_txfm) {
    int start = aom_tell_size(w);

    write_tokens_b(cpi, &td->mb, w, tok, tok_end);

    const int end = aom_tell_size(w);
    td->coefficient_size += end - start;
  }
}